

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AlterBeginAddColumn(Parse *pParse,SrcList *pSrc)

{
  u8 uVar1;
  int iVar2;
  Table *pTVar3;
  Table *pTVar4;
  Column *pCVar5;
  char *pcVar6;
  ExprList *pEVar7;
  Parse *in_RDI;
  ExprList *unaff_retaddr;
  Column *pCol;
  sqlite3 *db;
  int nAlloc;
  int i;
  int iDb;
  Table *pTab;
  Table *pNew;
  Parse *in_stack_ffffffffffffffb8;
  sqlite3 *in_stack_ffffffffffffffc0;
  sqlite3 *db_00;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar8;
  int local_28;
  
  iVar8 = -0x55555556;
  db_00 = in_RDI->db;
  if ((db_00->mallocFailed == '\0') &&
     (pTVar3 = sqlite3LocateTableItem
                         ((Parse *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd0),
                          (u32)((ulong)db_00 >> 0x20),(SrcItem *)in_stack_ffffffffffffffc0),
     pTVar3 != (Table *)0x0)) {
    if (pTVar3->eTabType == '\x01') {
      sqlite3ErrorMsg(in_RDI,"virtual tables may not be altered");
    }
    else if (pTVar3->eTabType == '\x02') {
      sqlite3ErrorMsg(in_RDI,"Cannot add a column to a view");
    }
    else {
      iVar2 = isAlterableTable(in_stack_ffffffffffffffb8,(Table *)0x1c7163);
      if (iVar2 == 0) {
        sqlite3MayAbort(in_RDI);
        iVar2 = sqlite3SchemaToIndex(db_00,pTVar3->pSchema);
        pTVar4 = (Table *)sqlite3DbMallocZero(in_stack_ffffffffffffffc0,
                                              (u64)in_stack_ffffffffffffffb8);
        if (pTVar4 != (Table *)0x0) {
          in_RDI->pNewTable = pTVar4;
          pTVar4->nTabRef = 1;
          pTVar4->nCol = pTVar3->nCol;
          iVar8 = ((pTVar4->nCol + -1) / 8) * 8 + 8;
          pCVar5 = (Column *)
                   sqlite3DbMallocZero(in_stack_ffffffffffffffc0,(u64)in_stack_ffffffffffffffb8);
          pTVar4->aCol = pCVar5;
          pcVar6 = sqlite3MPrintf(db_00,"sqlite_altertab_%s",pTVar3->zName);
          pTVar4->zName = pcVar6;
          if ((pTVar4->aCol != (Column *)0x0) && (pTVar4->zName != (char *)0x0)) {
            memcpy(pTVar4->aCol,pTVar3->aCol,(long)pTVar4->nCol << 4);
            for (local_28 = 0; local_28 < pTVar4->nCol; local_28 = local_28 + 1) {
              pCVar5 = pTVar4->aCol + local_28;
              pcVar6 = sqlite3DbStrDup(db_00,(char *)pCVar5);
              pCVar5->zCnName = pcVar6;
              uVar1 = sqlite3StrIHash(pCVar5->zCnName);
              pCVar5->hName = uVar1;
            }
            pEVar7 = sqlite3ExprListDup((sqlite3 *)pCol,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
            (pTVar4->u).tab.pDfltList = pEVar7;
            pTVar4->pSchema = db_00->aDb[iVar2].pSchema;
            (pTVar4->u).tab.addColOffset = (pTVar3->u).tab.addColOffset;
          }
        }
      }
    }
  }
  sqlite3SrcListDelete((sqlite3 *)CONCAT44(iVar8,in_stack_ffffffffffffffd0),(SrcList *)db_00);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterBeginAddColumn(Parse *pParse, SrcList *pSrc){
  Table *pNew;
  Table *pTab;
  int iDb;
  int i;
  int nAlloc;
  sqlite3 *db = pParse->db;

  /* Look up the table being altered. */
  assert( pParse->pNewTable==0 );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  if( db->mallocFailed ) goto exit_begin_add_column;
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_begin_add_column;

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be altered");
    goto exit_begin_add_column;
  }
#endif

  /* Make sure this is not an attempt to ALTER a view. */
  if( IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "Cannot add a column to a view");
    goto exit_begin_add_column;
  }
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ){
    goto exit_begin_add_column;
  }

  sqlite3MayAbort(pParse);
  assert( IsOrdinaryTable(pTab) );
  assert( pTab->u.tab.addColOffset>0 );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);

  /* Put a copy of the Table struct in Parse.pNewTable for the
  ** sqlite3AddColumn() function and friends to modify.  But modify
  ** the name by adding an "sqlite_altertab_" prefix.  By adding this
  ** prefix, we insure that the name will not collide with an existing
  ** table because user table are not allowed to have the "sqlite_"
  ** prefix on their name.
  */
  pNew = (Table*)sqlite3DbMallocZero(db, sizeof(Table));
  if( !pNew ) goto exit_begin_add_column;
  pParse->pNewTable = pNew;
  pNew->nTabRef = 1;
  pNew->nCol = pTab->nCol;
  assert( pNew->nCol>0 );
  nAlloc = (((pNew->nCol-1)/8)*8)+8;
  assert( nAlloc>=pNew->nCol && nAlloc%8==0 && nAlloc-pNew->nCol<8 );
  pNew->aCol = (Column*)sqlite3DbMallocZero(db, sizeof(Column)*nAlloc);
  pNew->zName = sqlite3MPrintf(db, "sqlite_altertab_%s", pTab->zName);
  if( !pNew->aCol || !pNew->zName ){
    assert( db->mallocFailed );
    goto exit_begin_add_column;
  }
  memcpy(pNew->aCol, pTab->aCol, sizeof(Column)*pNew->nCol);
  for(i=0; i<pNew->nCol; i++){
    Column *pCol = &pNew->aCol[i];
    pCol->zCnName = sqlite3DbStrDup(db, pCol->zCnName);
    pCol->hName = sqlite3StrIHash(pCol->zCnName);
  }
  assert( IsOrdinaryTable(pNew) );
  pNew->u.tab.pDfltList = sqlite3ExprListDup(db, pTab->u.tab.pDfltList, 0);
  pNew->pSchema = db->aDb[iDb].pSchema;
  pNew->u.tab.addColOffset = pTab->u.tab.addColOffset;
  assert( pNew->nTabRef==1 );

exit_begin_add_column:
  sqlite3SrcListDelete(db, pSrc);
  return;
}